

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O0

void __thiscall NaPNConstGen::set_const_value(NaPNConstGen *this,NaReal fConst)

{
  uint i;
  NaReal fConst_local;
  NaPNConstGen *this_local;
  
  for (i = 0; i < this->nOutDim; i = i + 1) {
    this->fConstVal[i] = fConst;
  }
  return;
}

Assistant:

void
NaPNConstGen::set_const_value (NaReal fConst)
{
    //!!!check_tunable();

    unsigned    i;
    for(i = 0; i < nOutDim; ++i){
        fConstVal[i] = fConst;
    }
}